

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::StoD(Forth *this)

{
  uint uVar1;
  
  requireDStackDepth(this,1,"S>D");
  requireDStackAvailable(this,1,"S>D");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::push(&this->dStack,(int)uVar1 >> 0x1f);
  return;
}

Assistant:

void StoD(){
			REQUIRE_DSTACK_DEPTH(1, "S>D");
			REQUIRE_DSTACK_AVAILABLE(1, "S>D");
			SCell top = dStack.getTop();
			if (top < 0)
				dStack.push(-1);
			else
				dStack.push(0);
		}